

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

void __thiscall SceneRender::renderDevLook(SceneRender *this,Uniforms *_uniforms)

{
  pointer ppMVar1;
  pointer ppMVar2;
  ulong uVar3;
  
  ppMVar1 = (this->m_devlook_spheres).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar2 = (this->m_devlook_spheres).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppMVar2 != ppMVar1) {
    uVar3 = 0;
    do {
      if (ppMVar1[uVar3]->m_model_vbo != (Vbo *)0x0) {
        vera::Shader::use(&ppMVar1[uVar3]->mainShader);
        (*(_uniforms->super_Scene)._vptr_Scene[0x3e])
                  (_uniforms,
                   &(this->m_devlook_spheres).
                    super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar3]->mainShader,1,1);
        vera::Model::render((this->m_devlook_spheres).
                            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar3]);
        ppMVar1 = (this->m_devlook_spheres).
                  super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppMVar2 = (this->m_devlook_spheres).
                  super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)ppMVar2 - (long)ppMVar1 >> 3));
  }
  ppMVar1 = (this->m_devlook_billboards).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar2 = (this->m_devlook_billboards).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppMVar2 != ppMVar1) {
    uVar3 = 0;
    do {
      if (ppMVar1[uVar3]->m_model_vbo != (Vbo *)0x0) {
        vera::Shader::use(&ppMVar1[uVar3]->mainShader);
        (*(_uniforms->super_Scene)._vptr_Scene[0x3e])
                  (_uniforms,
                   &(this->m_devlook_billboards).
                    super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar3]->mainShader,1,1);
        vera::Model::render((this->m_devlook_billboards).
                            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar3]);
        ppMVar1 = (this->m_devlook_billboards).
                  super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppMVar2 = (this->m_devlook_billboards).
                  super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)ppMVar2 - (long)ppMVar1 >> 3));
  }
  return;
}

Assistant:

void SceneRender::renderDevLook(Uniforms& _uniforms) {
    for (size_t i = 0; i < m_devlook_spheres.size(); i++) {
        if (m_devlook_spheres[i]->getVbo() == nullptr)
            continue;

        m_devlook_spheres[i]->getShader()->use();
        _uniforms.feedTo( m_devlook_spheres[i]->getShader() );
        m_devlook_spheres[i]->render();
    }

    for (size_t i = 0; i < m_devlook_billboards.size(); i++) {
        if (m_devlook_billboards[i]->getVbo() == nullptr)
            continue;

        m_devlook_billboards[i]->getShader()->use();
        _uniforms.feedTo( m_devlook_billboards[i]->getShader() );
        m_devlook_billboards[i]->render();
    }
}